

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnginput.cc
# Opt level: O0

void __thiscall PngInput::readHeader(PngInput *this)

{
  int iVar1;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  bool bVar2;
  khr_df_transfer_e t;
  khr_df_primaries_e p;
  ulong uVar3;
  undefined8 uVar4;
  v10 *this_00;
  LodePNGColorMode *dest;
  runtime_error *this_01;
  vector<char,_std::allocator<char>_> *this_02;
  size_type sVar5;
  char **ppcVar6;
  ImageSpec *this_03;
  size_t in_RDI;
  Primaries primaries;
  FormatDescriptor *format;
  ImageInputFormatType formatType;
  uchar *pFirstChunk;
  uchar *pTrnsChunk;
  khr_df_model_e colorModel;
  uint32_t bitDepth;
  uint32_t componentCount;
  uint32_t h;
  uint32_t w;
  uint lodepngError;
  uint8_t filesig [8];
  uint8_t pngsig [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_04;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffbe4;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 uVar9;
  uint32_t in_stack_fffffffffffffbf4;
  undefined4 uVar10;
  khr_df_transfer_e in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 uVar11;
  uint32_t in_stack_fffffffffffffc04;
  uint32_t in_stack_fffffffffffffc08;
  uint32_t in_stack_fffffffffffffc0c;
  ImageSpec *in_stack_fffffffffffffc10;
  FormatDescriptor *this_05;
  string *in_stack_fffffffffffffc18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__first;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  LodePNGState *in_stack_fffffffffffffc28;
  const_iterator __position;
  uint *in_stack_fffffffffffffc30;
  uint *in_stack_fffffffffffffc38;
  khr_df_model_e in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  khr_df_flags_e f;
  void **in_stack_fffffffffffffc48;
  char ***pppcVar12;
  ImageInput *in_stack_fffffffffffffc58;
  size_t in_stack_fffffffffffffc60;
  float local_328;
  float local_324;
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  float local_310;
  float local_30c;
  uchar *local_308;
  uchar *local_300;
  FormatDescriptor *local_2f0;
  Origin local_2e3;
  undefined1 local_2e0 [132];
  undefined4 local_25c;
  char *local_258;
  char **local_250;
  undefined8 local_248;
  string local_240 [32];
  reference local_220;
  uchar *local_218;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined1 local_201;
  undefined1 local_200 [8];
  char *local_1f8;
  size_t local_1f0;
  string local_1e8 [32];
  undefined4 local_1c8;
  uint32_t local_1c4;
  uint local_1c0;
  unsigned_long_long in_stack_fffffffffffffe48;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_fffffffffffffe50;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar13;
  size_t sVar14;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_198 [2];
  undefined8 local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_180;
  char *local_178;
  size_t local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_168;
  char *local_160;
  size_t sStack_158;
  string *local_150;
  char *local_148;
  char **local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*>
  local_138;
  undefined8 local_118;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*>
  *local_110;
  char **local_108;
  char **local_f8;
  v10 *local_f0;
  char **local_e8;
  undefined8 uStack_e0;
  string *local_d8;
  char *local_d0;
  char ***local_c8;
  char *local_c0;
  char ***local_b8;
  char *local_b0;
  char **local_a8;
  char **local_a0;
  char *local_98;
  size_t sStack_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_88;
  undefined8 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_70;
  undefined8 local_68;
  undefined8 *local_60;
  char *local_58;
  char ***local_50;
  char **local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*>
  *local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*>
  *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*>
  *local_10;
  char *local_8;
  
  pvVar13 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0xa1a0a0d474e5089;
  sVar14 = in_RDI;
  std::istream::read(*(char **)(in_RDI + 0x218),(long)&stack0xfffffffffffffe50);
  uVar3 = std::ios::fail();
  if ((uVar3 & 1) != 0) {
    ImageInput::throwOnReadFailure(in_stack_fffffffffffffc58);
  }
  if (in_stack_fffffffffffffe50.values_ != pvVar13) {
    uVar4 = __cxa_allocate_exception(0x10);
    ImageInput::different_format::different_format
              ((different_format *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    __cxa_throw(uVar4,&ImageInput::different_format::typeinfo,
                ImageInput::different_format::~different_format);
  }
  std::istream::seekg(*(long *)(in_RDI + 0x218),_S_beg);
  slurp((PngInput *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  this_00 = (v10 *)(in_RDI + 0x570);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x1ae4c7);
  dest = (LodePNGColorMode *)
         std::vector<char,_std::allocator<char>_>::size
                   ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x2d0));
  local_1c0 = lodepng_decode_chunks
                        (in_stack_fffffffffffffc48,
                         (size_t *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                         in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                         in_stack_fffffffffffffc28,
                         (uchar *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                         in_stack_fffffffffffffc60);
  f = (khr_df_flags_e)in_stack_fffffffffffffc48;
  if (local_1c0 != 0) {
    local_201 = 1;
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_140 = &local_1f8;
    local_148 = "PNG decode chunks error: {}.";
    local_b0 = "PNG decode chunks error: {}.";
    local_1f8 = "PNG decode chunks error: {}.";
    local_a8 = local_140;
    local_1f0 = std::char_traits<char>::length((char_type *)0x1ae5b6);
    local_58 = local_148;
    local_200 = (undefined1  [8])lodepng_error_text(local_1c0);
    local_150 = local_1e8;
    local_160 = local_1f8;
    sStack_158 = local_1f0;
    local_168 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
                 *)local_200;
    local_a0 = &local_160;
    local_178 = local_1f8;
    local_170 = local_1f0;
    local_98 = local_178;
    sStack_90 = local_170;
    local_198[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*>
                             (local_168,this_00,(char **)local_150);
    local_80 = &local_188;
    local_88 = local_198;
    local_68 = 0xc;
    local_188 = 0xc;
    fmt.size_ = sVar14;
    fmt.data_ = (char *)pvVar13;
    args.field_1.values_ = in_stack_fffffffffffffe50.values_;
    args.desc_ = in_stack_fffffffffffffe48;
    local_78 = local_88;
    local_70 = local_88;
    local_60 = local_80;
    local_180 = local_88;
    ::fmt::v10::vformat_abi_cxx11_(fmt,args);
    std::runtime_error::runtime_error(this_01,local_1e8);
    local_201 = 0;
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lodepng_color_mode_copy(dest,(LodePNGColorMode *)0x1ae829);
  local_208 = 0;
  local_20c = *(undefined4 *)(in_RDI + 0x3cc);
  local_210 = 1;
  iVar1 = *(int *)(in_RDI + 0x3c8);
  if (iVar1 == 0) {
    if (*(int *)(in_RDI + 0x3e0) == 0) {
      local_208 = 1;
    }
    else {
      *(undefined4 *)(in_RDI + 0x390) = 4;
      local_208 = 2;
    }
    local_210 = 2;
  }
  else if (iVar1 == 2) {
    if (*(int *)(in_RDI + 0x3e0) == 0) {
      local_208 = 3;
    }
    else {
      *(undefined4 *)(in_RDI + 0x390) = 6;
      local_208 = 4;
    }
    local_210 = 1;
  }
  else if (iVar1 == 3) {
    local_218 = (uchar *)0x0;
    local_220 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x2d0),0x21);
    this_02 = (vector<char,_std::allocator<char>_> *)(in_RDI + 0x2d0);
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x2d0));
    std::vector<char,_std::allocator<char>_>::operator[](this_02,sVar5 - 1);
    local_218 = lodepng_chunk_find_const
                          ((uchar *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                           (uchar *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                           (char *)dest);
    if (local_218 == (uchar *)0x0) {
      *(undefined4 *)(in_RDI + 0x390) = 2;
      local_208 = 3;
    }
    else {
      *(undefined4 *)(in_RDI + 0x390) = 6;
      local_208 = 4;
    }
    local_210 = 1;
    if (*(uint *)(in_RDI + 0x3cc) < 8) {
      local_20c = 8;
    }
    pppcVar12 = &local_250;
    local_d0 = "Expanding {}-bit paletted image to {}";
    local_c0 = "Expanding {}-bit paletted image to {}";
    local_250 = (char **)0x2364e9;
    local_c8 = pppcVar12;
    local_b8 = pppcVar12;
    ppcVar6 = (char **)std::char_traits<char>::length((char_type *)0x1aeae4);
    pppcVar12[1] = ppcVar6;
    f = (khr_df_flags_e)pppcVar12;
    local_8 = local_d0;
    local_f0 = (v10 *)(in_RDI + 0x3cc);
    local_258 = "R8G8B8";
    if (*(int *)(in_RDI + 0x390) == 6) {
      local_258 = "R8G8B8A8";
    }
    local_d8 = local_240;
    local_e8 = local_250;
    uStack_e0 = local_248;
    local_f8 = &local_258;
    local_50 = &local_e8;
    local_108 = local_250;
    local_48 = local_108;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,char_const*>
              (&local_138,local_f0,(uint *)local_f8,local_250);
    local_30 = &local_118;
    local_20 = 0xc2;
    local_118 = 0xc2;
    fmt_00.size_ = sVar14;
    fmt_00.data_ = (char *)pvVar13;
    args_00.field_1.values_ = in_stack_fffffffffffffe50.values_;
    args_00.desc_ = in_stack_fffffffffffffe48;
    local_38 = &local_138;
    local_28 = &local_138;
    local_18 = local_30;
    local_10 = &local_138;
    local_110 = &local_138;
    ::fmt::v10::vformat_abi_cxx11_(fmt_00,args_00);
    ImageInput::fwarning
              ((ImageInput *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18);
    std::__cxx11::string::~string(local_240);
  }
  else if (iVar1 == 4) {
    local_208 = 2;
    local_210 = 2;
  }
  else if (iVar1 == 6) {
    local_210 = 1;
    local_208 = 4;
  }
  uVar10 = (undefined4)((ulong)dest >> 0x20);
  iVar1 = *(int *)(in_RDI + 0x3c8);
  if (iVar1 == 0) {
    local_25c = 0;
  }
  else if (iVar1 == 2) {
    local_25c = 2;
  }
  else if (iVar1 == 3) {
    local_25c = 3;
  }
  else if (iVar1 == 4) {
    local_25c = 1;
  }
  else if (iVar1 == 6) {
    local_25c = 3;
  }
  t = (int)in_RDI + 0x290;
  __position._M_current = &local_2e3.x;
  ImageSpec::Origin::Origin((Origin *)__position._M_current,'\0','\0');
  this_04 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar10,local_20c);
  uVar11 = 0;
  uVar9 = 1;
  uVar8 = 0;
  uVar7 = 0;
  uVar10 = local_210;
  ImageSpec::ImageSpec
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08,
             in_stack_fffffffffffffc04,(Origin *)CONCAT44(in_stack_fffffffffffffbfc,local_210),
             in_stack_fffffffffffffbf4,local_1c4,
             (khr_df_sample_datatype_qualifiers_e)__position._M_current,t,
             (khr_df_primaries_e)local_2e0,in_stack_fffffffffffffc40,f);
  std::vector<ImageInput::imageInfo,std::allocator<ImageInput::imageInfo>>::
  emplace_back<ImageSpec,ImageInputFormatType&>
            ((vector<ImageInput::imageInfo,_std::allocator<ImageInput::imageInfo>_> *)
             CONCAT44(in_stack_fffffffffffffbf4,uVar9),
             (ImageSpec *)CONCAT44(in_stack_fffffffffffffbec,uVar8),
             (ImageInputFormatType *)CONCAT44(in_stack_fffffffffffffbe4,uVar7));
  ImageSpec::~ImageSpec((ImageSpec *)0x1aee63);
  this_03 = ImageInput::spec((ImageInput *)0x1aee70);
  local_2f0 = ImageSpec::format(this_03);
  if (*(int *)(in_RDI + 0x4b4) == 0) {
    if (*(int *)(in_RDI + 0x4ac) == 0) {
      if (*(int *)(in_RDI + 0x480) == 0) {
        FormatDescriptor::setTransfer
                  ((FormatDescriptor *)CONCAT44(in_stack_fffffffffffffc04,uVar11),
                   in_stack_fffffffffffffbfc);
      }
      else {
        FormatDescriptor::setTransfer
                  ((FormatDescriptor *)CONCAT44(in_stack_fffffffffffffc04,uVar11),
                   in_stack_fffffffffffffbfc);
        (local_2f0->extended).oeGamma = (float)*(uint *)(in_RDI + 0x484) / 100000.0;
      }
    }
    else {
      FormatDescriptor::setTransfer
                ((FormatDescriptor *)CONCAT44(in_stack_fffffffffffffc04,uVar11),
                 in_stack_fffffffffffffbfc);
      FormatDescriptor::setPrimaries(local_2f0,KHR_DF_PRIMARIES_BT709);
    }
  }
  else {
    FormatDescriptor::setPrimaries(local_2f0,KHR_DF_PRIMARIES_UNSPECIFIED);
    FormatDescriptor::setTransfer
              ((FormatDescriptor *)CONCAT44(in_stack_fffffffffffffc04,uVar11),
               in_stack_fffffffffffffbfc);
    std::__cxx11::string::operator=
              ((string *)&(local_2f0->extended).iccProfile,*(char **)(in_RDI + 0x4b8));
    Imageio::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffc04,uVar11),CONCAT44(in_stack_fffffffffffffbfc,uVar10)
              );
    __first = &(local_2f0->extended).iccProfile.profile;
    local_300 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_04);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffbe4,uVar7),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this_04);
    local_308 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                         insert<unsigned_char*,void>
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    CONCAT44(local_1c8,local_1c4),__position,(uchar *)__first,
                                    (uchar *)in_stack_fffffffffffffc10);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffbe4,uVar7),(char *)this_04);
    if (bVar2) {
      FormatDescriptor::setPrimaries(local_2f0,KHR_DF_PRIMARIES_BT2020);
      FormatDescriptor::setTransfer
                ((FormatDescriptor *)CONCAT44(in_stack_fffffffffffffc04,uVar11),
                 in_stack_fffffffffffffbfc);
    }
  }
  if (((*(int *)(in_RDI + 0x488) != 0) && (*(int *)(in_RDI + 0x4ac) == 0)) &&
     (*(int *)(in_RDI + 0x4b4) == 0)) {
    local_328 = (float)*(uint *)(in_RDI + 0x494) / 100000.0;
    local_324 = (float)*(uint *)(in_RDI + 0x498) / 100000.0;
    local_320 = (float)*(uint *)(in_RDI + 0x49c) / 100000.0;
    local_31c = (float)*(uint *)(in_RDI + 0x4a0) / 100000.0;
    local_318 = (float)*(uint *)(in_RDI + 0x4a4) / 100000.0;
    local_314 = (float)*(uint *)(in_RDI + 0x4a8) / 100000.0;
    local_310 = (float)*(uint *)(in_RDI + 0x48c) / 100000.0;
    local_30c = (float)*(uint *)(in_RDI + 0x490) / 100000.0;
    this_05 = local_2f0;
    p = findMapping(0x3b03126f,&local_328);
    FormatDescriptor::setPrimaries(this_05,p);
  }
  return;
}

Assistant:

void
PngInput::readHeader()
{
    // Unfortunately LoadPNG doesn't believe in stdio. The functions
    // we need either read from memory or take a file name. To avoid
    // a potentially unnecessary slurp of the whole file check the
    // signature ourselves.
    uint8_t pngsig[8] = {
       0x89, 0x50, 0x4e, 0x47, 0x0d, 0x0a, 0x1a, 0x0a
    };
    uint8_t filesig[sizeof(pngsig)];
    isp->read((char *)filesig, sizeof(pngsig));
    if (isp->fail())
       throwOnReadFailure();
    if (memcmp(filesig, pngsig, sizeof(pngsig)))
       throw different_format();

    // It's a PNG file.

    isp->seekg(0, isp->beg);
    // Slurp it into memory so we can use lodepng_inspect, to determine
    // the data type, and lodepng_chunk_find.
    //
    // Why no special case for when we've already read the file into a
    // stringstream (i.e. buffer.get() == isp)? Because the only way to access
    // such data is to call stringstream::str() which makes a copy. So treat
    // everything the same. For the same reason we slurp into a vector not
    // a stringstream here.
    slurp();

    unsigned int lodepngError;
    uint32_t w, h;
    lodepngError = lodepng_decode_chunks(&pIdat, &idatsize, &w, &h, &state,
                                         (const uint8_t*)pngBuffer.data(),
                                         pngBuffer.size());
    if (lodepngError) {
        throw std::runtime_error(
            fmt::format("PNG decode chunks error: {}.",
                        lodepng_error_text(lodepngError))
        );
    }

    // Tell the decoder to produce the same color type as the file. Exceptions
    // to this are made later.
    lodepng_color_mode_copy(&state.info_raw, &state.info_png.color);

    uint32_t componentCount = 0;
    uint32_t bitDepth = state.info_png.color.bitdepth;
    // Initialisation here keeps compilers happy in the LCT_MAX_OCTET cases.
    khr_df_model_e colorModel = KHR_DF_MODEL_RGBSDA;

    switch (state.info_png.color.colortype) {
      case LCT_GREY:
        if (state.info_png.color.key_defined) {
            state.info_raw.colortype = LCT_GREY_ALPHA;
            componentCount = 2;
            colorModel = KHR_DF_MODEL_YUVSDA;
        } else {
            componentCount = 1;
            colorModel = KHR_DF_MODEL_YUVSDA;
        }
        break;
      case LCT_RGB:
        if (state.info_png.color.key_defined) {
            state.info_raw.colortype = LCT_RGBA;
            componentCount = 4;
            colorModel = KHR_DF_MODEL_RGBSDA;
        } else {
            componentCount = 3;
            colorModel = KHR_DF_MODEL_RGBSDA;
        }
        break;
      case LCT_PALETTE: {
        // color.key_defined is not set for paletted. tRNS info is written
        // directly into the palette. To determine the colortype to expand to
        // here we need to check if there is a tRNS chunk.
	    const unsigned char *pTrnsChunk = nullptr;
        // 1st chunk after header
        const unsigned char* pFirstChunk = (unsigned char*)&pngBuffer[33];
        pTrnsChunk = lodepng_chunk_find_const(pFirstChunk,
                                (unsigned char*)&pngBuffer[pngBuffer.size()-1],
                                "tRNS");
        if (pTrnsChunk) {
            state.info_raw.colortype = LCT_RGBA;
            componentCount = 4;
            colorModel = KHR_DF_MODEL_RGBSDA;
        } else {
            state.info_raw.colortype = LCT_RGB;
            componentCount = 3;
            colorModel = KHR_DF_MODEL_RGBSDA;
        }
        // There are no paletted texture formats, except an ancient one in
        // OpenGL ES 1 & 2 so, rather than complicate the users of imageio
        // with handling for them, cause them to be expanded to 8 bits by
        // this reader and issue a warning.
        if (state.info_png.color.bitdepth < 8) {
            bitDepth = 8; // This value will be set in the ImageSpec and
                          // eventually passed back to readImage().
        }
        fwarning(fmt::format("Expanding {}-bit paletted image to {}",
                state.info_png.color.bitdepth,
                state.info_raw.colortype == LCT_RGBA ? "R8G8B8A8" : "R8G8B8"));
        }
        break;
      case LCT_GREY_ALPHA:
        componentCount = 2;
        colorModel = KHR_DF_MODEL_YUVSDA;
        break;
      case LCT_RGBA:
        colorModel = KHR_DF_MODEL_RGBSDA;
        componentCount = 4;
        break;
      case LCT_MAX_OCTET_VALUE:
        break;
    }

    ImageInputFormatType formatType;
    switch (state.info_png.color.colortype) {
    case LCT_GREY:
        formatType = ImageInputFormatType::png_l;
        break;
    case LCT_GREY_ALPHA:
        formatType = ImageInputFormatType::png_la;
        break;
    case LCT_RGB:
        formatType = ImageInputFormatType::png_rgb;
        break;
    case LCT_RGBA:
        formatType = ImageInputFormatType::png_rgba;
        break;
    case LCT_PALETTE:
        formatType = ImageInputFormatType::png_rgba;
        break;
    case LCT_MAX_OCTET_VALUE:
        break;
    }

  images.emplace_back(ImageSpec(w, h, 1,
                            ImageSpec::Origin(ImageSpec::Origin::eLeft, ImageSpec::Origin::eTop),
                            componentCount,
                            bitDepth,
                            static_cast<khr_df_sample_datatype_qualifiers_e>(0),
                            KHR_DF_TRANSFER_UNSPECIFIED,
                            // PNG spec. says BT.709 primaries are a
                            // reasonable default.
                            KHR_DF_PRIMARIES_BT709,
                            colorModel),
                        formatType);

    // This is ugly. FIXME:
    FormatDescriptor& format = const_cast<FormatDescriptor&>(spec().format());
    if (state.info_png.iccp_defined) {
        format.setPrimaries(KHR_DF_PRIMARIES_UNSPECIFIED);
        format.setTransfer(KHR_DF_TRANSFER_UNSPECIFIED);
        format.extended.iccProfile.name =  state.info_png.iccp_name;
        format.extended.iccProfile.profile.resize(state.info_png.iccp_profile_size);
        format.extended.iccProfile.profile.insert(
               format.extended.iccProfile.profile.begin(),
               state.info_png.iccp_profile,
               &state.info_png.iccp_profile[state.info_png.iccp_profile_size]);
        if (format.extended.iccProfile.name == "ITUR_2100_PQ_FULL") {
            format.setPrimaries(KHR_DF_PRIMARIES_BT2020);
            format.setTransfer(KHR_DF_TRANSFER_PQ_EOTF);
        }
    } else if (state.info_png.srgb_defined) {
        // srgb_intent is a guide for the user/application when applying
        // a color transform during rendering, especially when
        // gamut mapping. It does not affect the meaning or value
        // of the image pixels so there is nothing to do here.
        format.setTransfer(KHR_DF_TRANSFER_SRGB);
        format.setPrimaries(KHR_DF_PRIMARIES_SRGB);
    } else if (state.info_png.gama_defined) {
        format.setTransfer(KHR_DF_TRANSFER_UNSPECIFIED);
        // The value in the gAMA chunk is the exponent of the power curve
        // used for encoding the image, i.e. the OETF, * 100000.
        format.extended.oeGamma = (float)state.info_png.gama_gamma / 100000;
    } else {
        format.setTransfer(KHR_DF_TRANSFER_UNSPECIFIED);
    }

    if (state.info_png.chrm_defined
        && !state.info_png.srgb_defined && !state.info_png.iccp_defined) {
        Primaries primaries;
        primaries.Rx = (float)state.info_png.chrm_red_x / 100000;
        primaries.Ry = (float)state.info_png.chrm_red_y / 100000;
        primaries.Gx = (float)state.info_png.chrm_green_x / 100000;
        primaries.Gy = (float)state.info_png.chrm_green_y / 100000;
        primaries.Bx = (float)state.info_png.chrm_blue_x / 100000;
        primaries.By = (float)state.info_png.chrm_blue_y / 100000;
        primaries.Wx = (float)state.info_png.chrm_white_x / 100000;
        primaries.Wy = (float)state.info_png.chrm_white_y / 100000;
        format.setPrimaries(findMapping(&primaries, 0.002f));
    }
}